

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manipulation.h
# Opt level: O2

RefNull * wasm::ExpressionManipulator::refNull<wasm::LocalGet>(LocalGet *target,Type type)

{
  bool bVar1;
  RefNull *output;
  HeapType local_20;
  Type local_18;
  Type type_local;
  
  local_18.id = type.id;
  bVar1 = wasm::Type::isNullable(&local_18);
  if (bVar1) {
    local_20 = wasm::Type::getHeapType(&local_18);
    bVar1 = HeapType::isBottom(&local_20);
    if (bVar1) {
      (target->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id = RefNullId;
      (target->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 0;
      RefNull::finalize((RefNull *)target,local_18);
      return (RefNull *)target;
    }
  }
  __assert_fail("type.isNullable() && type.getHeapType().isBottom()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/manipulation.h"
                ,0x2c,
                "RefNull *wasm::ExpressionManipulator::refNull(InputType *, Type) [InputType = wasm::LocalGet]"
               );
}

Assistant:

inline RefNull* refNull(InputType* target, Type type) {
  assert(type.isNullable() && type.getHeapType().isBottom());
  auto* ret = convert<InputType, RefNull>(target);
  ret->finalize(type);
  return ret;
}